

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O3

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxFastRT(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,char *name)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  cpp_dec_float<50U,_int,_void> *pcVar2;
  
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxRatioTester = (_func_int **)&PTR_getName_003b2c98;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_name = name;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_type = LEAVE;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.prec_elem = 10;
  pnVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar2 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)
   ((long)(this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).delta.m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)
   ((long)(this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).delta.m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta,1e-06);
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxRatioTester = (_func_int **)&PTR_getName_003b2da0;
  (this->minStab).m_backend.fpclass = cpp_dec_float_finite;
  (this->minStab).m_backend.prec_elem = 10;
  (this->minStab).m_backend.data._M_elems[0] = 0;
  (this->minStab).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->minStab).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->minStab).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->minStab).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->minStab).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->minStab).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->minStab,1e-06);
  (this->epsilon).m_backend.fpclass = cpp_dec_float_finite;
  (this->epsilon).m_backend.prec_elem = 10;
  (this->epsilon).m_backend.data._M_elems[0] = 0;
  (this->epsilon).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->epsilon).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->epsilon).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->epsilon).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->epsilon).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->epsilon).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->epsilon,1e-16);
  (this->fastDelta).m_backend.fpclass = cpp_dec_float_finite;
  (this->fastDelta).m_backend.prec_elem = 10;
  (this->fastDelta).m_backend.data._M_elems[0] = 0;
  (this->fastDelta).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->fastDelta).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->fastDelta).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->fastDelta).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->fastDelta).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->fastDelta).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->fastDelta,1e-06);
  this->iscoid = false;
  return;
}

Assistant:

SPxFastRT(const char* name)
      : SPxRatioTester<R>(name)
      , minStab(SOPLEX_DEFAULT_BND_VIOL)
      , epsilon(SOPLEX_DEFAULT_EPS_ZERO)
      , fastDelta(SOPLEX_DEFAULT_BND_VIOL)
      , iscoid(false)
   {}